

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

FuncDef * sqlite3FunctionSearch(int h,char *zFunc)

{
  FuncDef *pFVar1;
  int iVar2;
  anon_union_8_2_1d015ad6_for_u *paVar3;
  
  paVar3 = (anon_union_8_2_1d015ad6_for_u *)(sqlite3BuiltinFunctions.a + h);
  while( true ) {
    pFVar1 = paVar3->pHash;
    if (pFVar1 == (FuncDef *)0x0) {
      return (FuncDef *)0x0;
    }
    iVar2 = sqlite3StrICmp(pFVar1->zName,zFunc);
    if (iVar2 == 0) break;
    paVar3 = &pFVar1->u;
  }
  return pFVar1;
}

Assistant:

SQLITE_PRIVATE FuncDef *sqlite3FunctionSearch(
  int h,               /* Hash of the name */
  const char *zFunc    /* Name of function */
){
  FuncDef *p;
  for(p=sqlite3BuiltinFunctions.a[h]; p; p=p->u.pHash){
    if( sqlite3StrICmp(p->zName, zFunc)==0 ){
      return p;
    }
  }
  return 0;
}